

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

int32_t uprv_getMaxValues_63(int32_t column)

{
  undefined4 local_c;
  int32_t column_local;
  
  if (column == 0) {
    local_c = 0xb23b8;
  }
  else if (column == 2) {
    local_c = 0x2a75a31;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

U_CFUNC int32_t
uprv_getMaxValues(int32_t column) {
    switch(column) {
    case 0:
        return indexes[UPROPS_MAX_VALUES_INDEX];
    case 2:
        return indexes[UPROPS_MAX_VALUES_2_INDEX];
    default:
        return 0;
    }
}